

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

int maxn(lua_State *L)

{
  int iVar1;
  double dVar2;
  double local_10;
  
  luaL_checktype(L,1,5);
  lua_pushnil(L);
  iVar1 = lua_next(L,1);
  if (iVar1 == 0) {
    local_10 = 0.0;
  }
  else {
    local_10 = 0.0;
    do {
      lua_settop(L,-2);
      iVar1 = lua_type(L,-1);
      dVar2 = local_10;
      if ((iVar1 == 3) && (dVar2 = lua_tonumber(L,-1), dVar2 <= local_10)) {
        dVar2 = local_10;
      }
      local_10 = dVar2;
      iVar1 = lua_next(L,1);
    } while (iVar1 != 0);
  }
  lua_pushnumber(L,local_10);
  return 1;
}

Assistant:

static int maxn (lua_State *L) {
  lua_Number max = 0;
  luaL_checktype(L, 1, LUA_TTABLE);
  lua_pushnil(L);  /* first key */
  while (lua_next(L, 1)) {
    lua_pop(L, 1);  /* remove value */
    if (lua_type(L, -1) == LUA_TNUMBER) {
      lua_Number v = lua_tonumber(L, -1);
      if (v > max) max = v;
    }
  }
  lua_pushnumber(L, max);
  return 1;
}